

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int act_disp_exts(nt_opts *opts)

{
  nifti_image *nim;
  long lVar1;
  ulong uVar2;
  long lVar3;
  char mesg [32];
  char local_58 [40];
  
  if (2 < g_debug) {
    act_disp_exts_cold_1();
  }
  if (0 < (opts->infiles).len) {
    lVar3 = 0;
    do {
      nim = nt_image_read(opts,(opts->infiles).list[lVar3],0);
      if (nim == (nifti_image *)0x0) {
        return 1;
      }
      if (0 < g_debug) {
        fprintf(_stdout,"header file \'%s\', num_ext = %d\n",nim->fname,(ulong)(uint)nim->num_ext);
      }
      if (0 < nim->num_ext) {
        lVar1 = 0;
        uVar2 = 0;
        do {
          sprintf(local_58,"    ext #%d : ",uVar2 & 0xffffffff);
          disp_nifti1_extension
                    (local_58,(nifti1_extension *)((long)&nim->ext_list->esize + lVar1),-1);
          uVar2 = uVar2 + 1;
          lVar1 = lVar1 + 0x10;
        } while ((long)uVar2 < (long)nim->num_ext);
      }
      nifti_image_free(nim);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (opts->infiles).len);
  }
  return 0;
}

Assistant:

int act_disp_exts( nt_opts * opts )
{
   nifti_image * nim;
   char          mesg[32];
   int           ec, fc;

   if( g_debug > 2 )
      fprintf(stderr,"-d displaying all extensions for %d files...\n",
              opts->infiles.len);

   for( fc = 0; fc < opts->infiles.len; fc++ )
   {
      nim = nt_image_read(opts, opts->infiles.list[fc], 0);
      if( !nim ) return 1;  /* errors are printed from library */

      if( g_debug > 0 )
         fprintf(stdout,"header file '%s', num_ext = %d\n",
                 nim->fname, nim->num_ext);
      for( ec = 0; ec < nim->num_ext; ec++ )
      {
         sprintf(mesg, "    ext #%d : ", ec);
         disp_nifti1_extension(mesg, nim->ext_list + ec, -1);
      }

      nifti_image_free(nim);
   }

   return 0;
}